

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsread.c
# Opt level: O0

phits_file_t phits_open_file(char *filename)

{
  phits_file_t pVar1;
  long in_RDI;
  phits_fileinternal_t *f;
  phits_file_t out;
  
  if (in_RDI == 0) {
    phits_error((char *)0x102bad);
  }
  pVar1 = phits_open_internal(filename);
  return (phits_file_t)pVar1.internal;
}

Assistant:

phits_file_t phits_open_file( const char * filename )
{
  if (!filename)
    phits_error("phits_open_file called with null string for filename");

  //Open, classify and process first record with mcnp type and version info:
  phits_file_t out = phits_open_internal( filename );
  phits_fileinternal_t * f = (phits_fileinternal_t *)out.internal;
  assert(f);

  out.internal = f;
  return out;
}